

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  DescriptorBuilder *this_00;
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  const_iterator intermediate_fields_iter;
  iterator intermediate_fields_end;
  Message *pMVar2;
  anon_union_8_8_13f84498_for_Symbol_2 aVar3;
  OptionInterpreter *pOVar4;
  vector<int,_std::allocator<int>_> *__k;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar7;
  LogMessage *pLVar8;
  UninterpretedOption *pUVar9;
  undefined8 *puVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  UnknownFieldSet *pUVar13;
  string *psVar14;
  mapped_type *pmVar15;
  mapped_type *this_01;
  byte bVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  long lVar18;
  undefined4 extraout_EDX;
  Reflection *this_02;
  Reflection *this_03;
  undefined8 uVar19;
  ulong uVar20;
  long lVar21;
  Symbol SVar22;
  FieldDescriptor *field;
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  size_type __dnew;
  undefined4 local_21c;
  anon_union_8_8_13f84498_for_Symbol_2 local_218;
  anon_union_8_8_13f84498_for_Symbol_2 local_210;
  anon_union_8_8_13f84498_for_Symbol_2 local_208;
  undefined8 local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [2];
  anon_union_8_8_13f84498_for_Symbol_2 local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [2];
  char local_198;
  uint8 *local_190;
  anon_union_8_8_13f84498_for_Symbol_2 local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_8_8_13f84498_for_Symbol_2 local_160;
  long local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_8_8_13f84498_for_Symbol_2 local_140;
  undefined8 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  vector<int,_std::allocator<int>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  const_iterator local_e8;
  iterator iStack_e0;
  FieldDescriptor **local_d8;
  Message *local_c8;
  FieldDescriptor **local_c0;
  anon_union_8_8_13f84498_for_Symbol_2 local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  OptionInterpreter *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  LogMessage local_68;
  undefined4 extraout_var_00;
  
  if ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_1d0.descriptor = (Descriptor *)local_1c0;
    local_68._0_8_ = 0x18;
    local_1d0.descriptor =
         (Descriptor *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_68);
    local_1c0[0]._M_allocated_capacity = local_68._0_8_;
    *(undefined8 *)local_1d0.descriptor = 0x6d206e6f6974704f;
    *(undefined8 *)(local_1d0.descriptor + 8) = 0x6576616820747375;
    *(undefined8 *)(local_1d0.descriptor + 0x10) = 0x2e656d616e206120;
    local_1c8 = local_68._0_8_;
    local_1d0.descriptor[local_68._0_8_] = (Descriptor)0x0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_1d0);
  }
  else {
    iVar6 = std::__cxx11::string::compare
                      (*(char **)((long)((this->uninterpreted_option_->name_).
                                         super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18));
    if (iVar6 != 0) {
      this_00 = this->builder_;
      iVar6 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
      SVar22 = FindSymbolNotEnforcingDeps
                         (this_00,*(string **)(CONCAT44(extraout_var,iVar6) + 8),true);
      if (SVar22.type != MESSAGE) {
        aVar7._0_4_ = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
        aVar7._4_4_ = extraout_var_00;
        SVar22.field_1.descriptor = aVar7.descriptor;
        SVar22._0_8_ = aVar7;
      }
      local_218 = SVar22.field_1;
      if ((DescriptorBuilder *)local_218.descriptor == (DescriptorBuilder *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x18e5);
        pLVar8 = internal::LogMessage::operator<<(&local_68,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_1d0,pLVar8);
        internal::LogMessage::~LogMessage(&local_68);
      }
      local_210.descriptor = (Descriptor *)0x0;
      local_d8 = (FieldDescriptor **)0x0;
      local_e8._M_current = (FieldDescriptor **)0x0;
      iStack_e0._M_current = (FieldDescriptor **)0x0;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_c8 = options;
      std::vector<int,_std::allocator<int>_>::vector(&local_120,options_path);
      pUVar9 = this->uninterpreted_option_;
      iVar6 = (pUVar9->name_).super_RepeatedPtrFieldBase.current_size_;
      bVar16 = 0 < iVar6;
      local_70 = src_path;
      if (iVar6 < 1) {
        local_21c = SUB84(pUVar9,0);
      }
      else {
        bVar16 = true;
        lVar21 = 0;
        local_21c = extraout_EDX;
        do {
          local_c0 = (FieldDescriptor **)CONCAT71(local_c0._1_7_,bVar16);
          psVar14 = *(string **)
                     ((long)((pUVar9->name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar21] +
                     0x18);
          if (local_108._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_108);
          }
          if (*(char *)((long)((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.rep_)
                              ->elements[lVar21] + 0x20) == '\x01') {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208,"(",psVar14);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar12) {
              local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_1c0[0]._8_8_ = puVar10[3];
              local_1d0.descriptor = (Descriptor *)local_1c0;
            }
            else {
              local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_1d0.descriptor = (Descriptor *)*puVar10;
            }
            local_1c8 = puVar10[1];
            *puVar10 = paVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_1d0);
            if (local_1d0.descriptor != (Descriptor *)local_1c0) {
              operator_delete(local_1d0.descriptor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.descriptor != local_1f8) {
              operator_delete(local_208.descriptor);
            }
            aVar7 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
            SVar22 = LookupSymbol((DescriptorBuilder *)aVar7.descriptor,psVar14,
                                  &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,
                                  LOOKUP_ALL,true);
            if (SVar22.type == FIELD) {
              local_210 = SVar22.field_1;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_108,(ulong)(psVar14->_M_dataplus)._M_p);
            aVar7 = local_218;
            local_210.field_descriptor = Descriptor::FindFieldByName(local_218.descriptor,psVar14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210.descriptor ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (this->builder_->pool_->allow_unknown_ != false) {
LAB_002e6023:
              AddWithoutInterpreting
                        ((OptionInterpreter *)aVar7.descriptor,this->uninterpreted_option_,local_c8)
              ;
              local_21c = 1;
              bVar5 = false;
              goto LAB_002e6827;
            }
            if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_180,"Option \"",&local_108);
              paVar12 = &local_170;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
              local_208.descriptor = (Descriptor *)local_1f8;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar17) {
                local_1f8[0]._0_8_ = paVar17->_M_allocated_capacity;
                local_1f8[0]._8_8_ = puVar10[3];
              }
              else {
                local_1f8[0]._0_8_ = paVar17->_M_allocated_capacity;
                local_208.descriptor = (Descriptor *)*puVar10;
              }
              local_200 = puVar10[1];
              *puVar10 = paVar17;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar17) {
                local_1c0[0]._0_8_ = paVar17->_M_allocated_capacity;
                local_1c0[0]._8_8_ = puVar10[3];
                local_1d0.descriptor = (Descriptor *)local_1c0;
              }
              else {
                local_1c0[0]._0_8_ = paVar17->_M_allocated_capacity;
                local_1d0.descriptor = (Descriptor *)*puVar10;
              }
              local_1c8 = puVar10[1];
              *puVar10 = paVar17;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_1d0)
              ;
              if (local_1d0.descriptor != (Descriptor *)local_1c0) {
                operator_delete(local_1d0.descriptor);
              }
              aVar7 = local_180;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.descriptor != local_1f8) {
                operator_delete(local_208.descriptor);
                aVar7 = local_180;
              }
              goto LAB_002e6897;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,"Option \"",&local_108);
            plVar11 = (long *)std::__cxx11::string::append((char *)local_b8);
            local_160.descriptor = (Descriptor *)&local_150;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar12) {
              local_150._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_150._8_8_ = plVar11[3];
            }
            else {
              local_150._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_160.descriptor = (Descriptor *)*plVar11;
            }
            local_158 = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_160,
                                 (ulong)(this->builder_->undefine_resolved_name_)._M_dataplus._M_p);
            local_140.descriptor = (Descriptor *)&local_130;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar12) {
              local_130._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_130._8_8_ = puVar10[3];
            }
            else {
              local_130._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_140.descriptor = (Descriptor *)*puVar10;
            }
            local_138 = puVar10[1];
            *puVar10 = paVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar12) {
              local_170._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_170._8_8_ = puVar10[3];
              local_180.descriptor = (Descriptor *)&local_170;
            }
            else {
              local_170._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_180.descriptor = (Descriptor *)*puVar10;
            }
            local_178 = puVar10[1];
            *puVar10 = paVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_108);
            uVar19 = 0xf;
            if (local_180.descriptor != (Descriptor *)&local_170) {
              uVar19 = local_170._M_allocated_capacity;
            }
            if ((ulong)uVar19 < (ulong)(local_178 + local_90)) {
              uVar20 = 0xf;
              if (local_98 != local_88) {
                uVar20 = local_88[0];
              }
              if (uVar20 < (ulong)(local_178 + local_90)) goto LAB_002e652f;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_98,0,(char *)0x0,(ulong)local_180);
            }
            else {
LAB_002e652f:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_98);
            }
            local_208.descriptor = (Descriptor *)local_1f8;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar12) {
              local_1f8[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_1f8[0]._8_8_ = puVar10[3];
            }
            else {
              local_1f8[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_208.descriptor = (Descriptor *)*puVar10;
            }
            local_200 = puVar10[1];
            *puVar10 = paVar12;
            puVar10[1] = 0;
            paVar12->_M_local_buf[0] = '\0';
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 == paVar12) {
              local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_1c0[0]._8_8_ = puVar10[3];
              local_1d0.descriptor = (Descriptor *)local_1c0;
            }
            else {
              local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
              local_1d0.descriptor = (Descriptor *)*puVar10;
            }
            local_1c8 = puVar10[1];
            *puVar10 = paVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_1d0);
            if (local_1d0.descriptor != (Descriptor *)local_1c0) {
              operator_delete(local_1d0.descriptor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.descriptor != local_1f8) {
              operator_delete(local_208.descriptor);
            }
            if (local_98 != local_88) {
              operator_delete(local_98);
            }
            if (local_180.descriptor != (Descriptor *)&local_170) {
              operator_delete(local_180.descriptor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140.descriptor != &local_130) {
              operator_delete(local_140.descriptor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.descriptor != &local_150) {
              operator_delete(local_160.descriptor);
            }
            paVar12 = &local_a8;
            aVar7 = local_b8[0];
LAB_002e66c6:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)aVar7.descriptor != paVar12) {
LAB_002e66cb:
              operator_delete(aVar7.descriptor);
            }
LAB_002e66d0:
            bVar5 = false;
            local_21c = 0;
          }
          else {
            if (*(DescriptorBuilder **)(local_210.descriptor + 0x50) !=
                (DescriptorBuilder *)local_218.descriptor) {
              if (*(char *)&((*(DescriptorBuilder **)(local_210.descriptor + 0x50))->dependencies_).
                            _M_t._M_impl.super__Rb_tree_header._M_header._M_right == '\x01')
              goto LAB_002e6023;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_140,"Option field \"",&local_108);
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar12) {
                local_170._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_170._8_8_ = puVar10[3];
                local_180.descriptor = (Descriptor *)&local_170;
              }
              else {
                local_170._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_180.descriptor = (Descriptor *)*puVar10;
              }
              local_178 = puVar10[1];
              *puVar10 = paVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_180,**(ulong **)local_218.descriptor);
              local_208.descriptor = (Descriptor *)local_1f8;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar12) {
                local_1f8[0]._0_8_ = paVar12->_M_allocated_capacity;
                local_1f8[0]._8_8_ = puVar10[3];
              }
              else {
                local_1f8[0]._0_8_ = paVar12->_M_allocated_capacity;
                local_208.descriptor = (Descriptor *)*puVar10;
              }
              local_200 = puVar10[1];
              *puVar10 = paVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 == paVar12) {
                local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                local_1c0[0]._8_8_ = puVar10[3];
                local_1d0.descriptor = (Descriptor *)local_1c0;
              }
              else {
                local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                local_1d0.descriptor = (Descriptor *)*puVar10;
              }
              local_1c8 = puVar10[1];
              *puVar10 = paVar12;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_1d0)
              ;
              if (local_1d0.descriptor != (Descriptor *)local_1c0) {
                operator_delete(local_1d0.descriptor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.descriptor != local_1f8) {
                operator_delete(local_208.descriptor);
              }
              if (local_180.descriptor != (Descriptor *)&local_170) {
                operator_delete(local_180.descriptor);
              }
              paVar12 = &local_130;
              aVar7 = local_140;
              goto LAB_002e66c6;
            }
            local_1d0._0_4_ = *(int *)(local_210.descriptor + 0x44);
            if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_120,
                         (iterator)
                         local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)&local_1d0);
            }
            else {
              *local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(int *)(local_210.descriptor + 0x44);
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            aVar7 = local_210;
            bVar5 = true;
            if (lVar21 < (long)(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.
                               current_size_ + -1) {
              if (*(once_flag **)(local_210.descriptor + 0x30) != (once_flag *)0x0) {
                local_1d0.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
                local_208.descriptor = local_210.descriptor;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(local_210.descriptor + 0x30),
                           (_func_void_FieldDescriptor_ptr **)&local_1d0.descriptor,
                           &local_208.field_descriptor);
              }
              if ((*(uint *)(aVar7.descriptor + 0x38) & 0xfffffffe) == 10) {
                if (*(int *)(local_210.descriptor + 0x3c) != 3) {
                  if (iStack_e0._M_current == local_d8) {
                    std::
                    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                *)&local_e8,iStack_e0,&local_210.field_descriptor);
                  }
                  else {
                    *iStack_e0._M_current = (FieldDescriptor *)local_210;
                    iStack_e0._M_current = iStack_e0._M_current + 1;
                  }
                  aVar7 = local_210;
                  if (*(once_flag **)(local_210.descriptor + 0x30) != (once_flag *)0x0) {
                    local_1d0.descriptor = local_210.descriptor;
                    std::
                    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                              (*(once_flag **)(local_210.descriptor + 0x30),
                               FieldDescriptor::TypeOnceInit,&local_1d0.field_descriptor);
                  }
                  local_218 = (anon_union_8_8_13f84498_for_Symbol_2)
                              ((anon_union_8_8_13f84498_for_Symbol_2 *)(aVar7.descriptor + 0x68))->
                              descriptor;
                  goto LAB_002e6827;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_208,"Option field \"",&local_108);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 == paVar12) {
                  local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                  local_1c0[0]._8_8_ = puVar10[3];
                  local_1d0.descriptor = (Descriptor *)local_1c0;
                }
                else {
                  local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                  local_1d0.descriptor = (Descriptor *)*puVar10;
                }
                local_1c8 = puVar10[1];
                *puVar10 = paVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,
                         (string *)&local_1d0);
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_208,"Option \"",&local_108);
                puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_208);
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar10 == paVar12) {
                  local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                  local_1c0[0]._8_8_ = puVar10[3];
                  local_1d0.descriptor = (Descriptor *)local_1c0;
                }
                else {
                  local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
                  local_1d0.descriptor = (Descriptor *)*puVar10;
                }
                local_1c8 = puVar10[1];
                *puVar10 = paVar12;
                puVar10[1] = 0;
                *(undefined1 *)(puVar10 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,
                         (string *)&local_1d0);
              }
              paVar12 = local_1f8;
              aVar7 = local_208;
              if (local_1d0.descriptor != (Descriptor *)local_1c0) {
                operator_delete(local_1d0.descriptor);
                aVar7 = local_208;
              }
LAB_002e6897:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)aVar7.descriptor != paVar12) goto LAB_002e66cb;
              goto LAB_002e66d0;
            }
          }
LAB_002e6827:
          if (!bVar5) {
            bVar16 = (byte)local_c0;
            break;
          }
          lVar21 = lVar21 + 1;
          pUVar9 = this->uninterpreted_option_;
          lVar18 = (long)(pUVar9->name_).super_RepeatedPtrFieldBase.current_size_;
          bVar16 = lVar21 < lVar18;
        } while (lVar21 < lVar18);
      }
      pMVar2 = local_c8;
      intermediate_fields_end._M_current = iStack_e0._M_current;
      intermediate_fields_iter._M_current = local_e8._M_current;
      aVar7 = local_210;
      if ((bVar16 & 1) == 0) {
        if (*(int *)(local_210.descriptor + 0x3c) != 3) {
          (*(local_c8->super_MessageLite)._vptr_MessageLite[0x15])(local_c8);
          pUVar13 = Reflection::GetUnknownFields(this_02,pMVar2);
          bVar5 = ExamineIfOptionIsSet
                            (this,intermediate_fields_iter,
                             (const_iterator)intermediate_fields_end._M_current,
                             aVar7.field_descriptor,&local_108,pUVar13);
          if (!bVar5) {
            local_21c._0_1_ = 0;
            goto LAB_002e6d1d;
          }
        }
        local_160.descriptor = (Descriptor *)operator_new(0x18);
        *(size_type *)local_160.descriptor = 0;
        *(undefined8 *)(local_160.descriptor + 8) = 0;
        *(undefined8 *)(local_160.descriptor + 0x10) = 0;
        bVar5 = SetOptionValue(this,local_210.field_descriptor,
                               (UnknownFieldSet *)local_160.descriptor);
        if (bVar5) {
          local_218 = (anon_union_8_8_13f84498_for_Symbol_2)iStack_e0._M_current;
          aVar7 = local_218;
          local_78 = this;
          do {
            local_218 = aVar7;
            local_c0 = local_e8._M_current;
            if (local_218 == (anon_union_8_8_13f84498_for_Symbol_2)local_e8._M_current) break;
            local_b8[0].descriptor = (Descriptor *)operator_new(0x18);
            *(size_type *)local_b8[0].descriptor = 0;
            *(undefined8 *)(local_b8[0].descriptor + 8) = 0;
            *(undefined8 *)(local_b8[0].descriptor + 0x10) = 0;
            aVar1 = (anon_union_8_8_13f84498_for_Symbol_2)
                    ((anon_union_8_8_13f84498_for_Symbol_2 *)((long)local_218 + -8))->descriptor;
            if (*(once_flag **)(aVar1.descriptor + 0x30) != (once_flag *)0x0) {
              local_1d0.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
              local_180 = aVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(aVar1.descriptor + 0x30),
                         (_func_void_FieldDescriptor_ptr **)&local_1d0.descriptor,
                         &local_180.field_descriptor);
            }
            aVar7.descriptor = local_218.descriptor + -8;
            if (*(int *)(aVar1.descriptor + 0x38) == 10) {
              pUVar13 = UnknownFieldSet::AddGroup
                                  ((UnknownFieldSet *)local_b8[0].descriptor,
                                   *(int *)(*aVar7.field_descriptor + 0x44));
              UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_160.descriptor);
LAB_002e6b2a:
              aVar3 = local_b8[0];
              aVar1 = local_160;
              local_b8[0].descriptor = (Descriptor *)0x0;
              local_160 = aVar3;
              bVar5 = true;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)aVar1.descriptor !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                          ((default_delete<google::protobuf::UnknownFieldSet> *)&local_160,
                           (UnknownFieldSet *)aVar1.descriptor);
              }
            }
            else {
              if (*(int *)(aVar1.descriptor + 0x38) == 0xb) {
                psVar14 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                                    ((UnknownFieldSet *)local_b8[0].descriptor,
                                     *(int *)(*aVar7.field_descriptor + 0x44));
                io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_180,psVar14)
                ;
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)&local_1d0,(ZeroCopyOutputStream *)&local_180,true);
                local_190 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                      ((UnknownFieldSet *)local_160.descriptor,local_190,
                                       (EpsCopyOutputStream *)&local_1d0);
                local_190 = io::EpsCopyOutputStream::FlushAndResetBuffer
                                      ((EpsCopyOutputStream *)&local_1d0,local_190);
                if (local_198 == '\x01') {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)&local_208,LOGLEVEL_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                             ,0x196f);
                  pLVar8 = internal::LogMessage::operator<<
                                     ((LogMessage *)&local_208,"CHECK failed: !out.HadError(): ");
                  pLVar8 = internal::LogMessage::operator<<
                                     (pLVar8,
                                      "Unexpected failure while serializing option submessage ");
                  pLVar8 = internal::LogMessage::operator<<(pLVar8,&local_108);
                  pLVar8 = internal::LogMessage::operator<<(pLVar8,"\".");
                  internal::LogFinisher::operator=((LogFinisher *)&local_140,pLVar8);
                  internal::LogMessage::~LogMessage((LogMessage *)&local_208);
                }
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_1d0);
                goto LAB_002e6b2a;
              }
              internal::LogMessage::LogMessage
                        ((LogMessage *)&local_1d0,LOGLEVEL_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x197c);
              pLVar8 = internal::LogMessage::operator<<
                                 ((LogMessage *)&local_1d0,"Invalid wire type for CPPTYPE_MESSAGE: "
                                 );
              aVar1.descriptor = *aVar7.descriptor;
              if (*(once_flag **)(aVar1.descriptor + 0x30) != (once_flag *)0x0) {
                local_180.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
                local_140.descriptor = aVar1.descriptor;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(aVar1.descriptor + 0x30),
                           (_func_void_FieldDescriptor_ptr **)&local_180.descriptor,
                           &local_140.field_descriptor);
              }
              pLVar8 = internal::LogMessage::operator<<(pLVar8,*(int *)(aVar1.descriptor + 0x38));
              internal::LogFinisher::operator=((LogFinisher *)&local_180,pLVar8);
              internal::LogMessage::~LogMessage((LogMessage *)&local_1d0);
              bVar5 = false;
              local_21c = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8[0].descriptor !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                        ((default_delete<google::protobuf::UnknownFieldSet> *)local_b8,
                         (UnknownFieldSet *)local_b8[0].descriptor);
            }
          } while (bVar5);
          __k = local_70;
          pOVar4 = local_78;
          pMVar2 = local_c8;
          if (local_218 == (anon_union_8_8_13f84498_for_Symbol_2)local_c0) {
            (*(local_c8->super_MessageLite)._vptr_MessageLite[0x15])(local_c8);
            pUVar13 = Reflection::MutableUnknownFields(this_03,pMVar2);
            UnknownFieldSet::MergeFrom(pUVar13,(UnknownFieldSet *)local_160.descriptor);
            if (*(int *)(local_210.descriptor + 0x3c) == 3) {
              pmVar15 = std::
                        map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[](&pOVar4->repeated_option_counts_,&local_120);
              iVar6 = *pmVar15;
              *pmVar15 = iVar6 + 1;
              local_1d0._0_4_ = iVar6;
              if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_120,
                           (iterator)
                           local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_1d0);
              }
              else {
                *local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar6;
                local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            this_01 = std::
                      map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&pOVar4->interpreted_paths_,__k);
            local_21c._0_1_ = 1;
            std::vector<int,_std::allocator<int>_>::operator=(this_01,&local_120);
          }
        }
        else {
          local_21c._0_1_ = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160.descriptor !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                    ((default_delete<google::protobuf::UnknownFieldSet> *)&local_160,
                     (UnknownFieldSet *)local_160.descriptor);
        }
      }
LAB_002e6d1d:
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if (local_e8._M_current != (FieldDescriptor **)0x0) {
        operator_delete(local_e8._M_current);
      }
      goto LAB_002e6d5b;
    }
    local_1d0.descriptor = (Descriptor *)local_1c0;
    local_68._0_8_ = 0x39;
    local_1d0.descriptor =
         (Descriptor *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_68);
    local_1c0[0]._M_allocated_capacity = local_68._0_8_;
    *(undefined8 *)(local_1d0.descriptor + 0x29) = 0x5f64657465727072;
    *(undefined8 *)(local_1d0.descriptor + 0x31) = 0x2e226e6f6974706f;
    *(undefined8 *)(local_1d0.descriptor + 0x20) = 0x746e696e75222065;
    *(undefined8 *)(local_1d0.descriptor + 0x28) = 0x6465746572707265;
    *(undefined8 *)(local_1d0.descriptor + 0x10) = 0x6573657220657375;
    *(undefined8 *)(local_1d0.descriptor + 0x18) = 0x6d616e2064657672;
    *(undefined8 *)local_1d0.descriptor = 0x6d206e6f6974704f;
    *(undefined8 *)(local_1d0.descriptor + 8) = 0x20746f6e20747375;
    local_1c8 = local_68._0_8_;
    local_1d0.descriptor[local_68._0_8_] = (Descriptor)0x0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.descriptor != local_1c0) {
    operator_delete(local_1d0.descriptor);
  }
  local_21c._0_1_ = 0;
LAB_002e6d5b:
  return (bool)((byte)local_21c & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}